

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>
::dx(FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>
     *this,int i)

{
  Fad<double> *pFVar1;
  FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  *pFVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar4;
  double *pdVar5;
  value_type vVar6;
  
  vVar6 = FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::dx(&((this->left_->fadexpr_).expr_)->fadexpr_,i);
  pFVar1 = this->right_;
  pdVar5 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar5 = (pFVar1->dx_).ptr_to_data + i;
  }
  pFVar2 = (this->left_->fadexpr_).expr_;
  pFVar3 = (pFVar2->fadexpr_).right_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  return -vVar6 * pFVar1->val_ -
         ((pFVar2->fadexpr_).left_.constant_ /
         (((pFVar4->fadexpr_).left_)->val_ * ((pFVar4->fadexpr_).right_)->val_ *
         ((pFVar3->fadexpr_).right_)->val_)) * *pdVar5;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}